

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::StructBuilderBody
          (GoGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  StructDef *struct_def_00;
  string *psVar1;
  bool bVar2;
  reference ppFVar3;
  char *nameprefix_00;
  Value *type;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  FieldDef *local_f8;
  FieldDef *field;
  undefined1 local_e8 [8];
  const_reverse_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  char *nameprefix_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)nameprefix;
  nameprefix_local = (char *)struct_def;
  struct_def_local = (StructDef *)this;
  NumToString<unsigned_long>(&local_90,struct_def->minalign);
  std::operator+(&local_70,"\tbuilder.Prep(",&local_90);
  std::operator+(&local_50,&local_70,", ");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  NumToString<unsigned_long>((string *)&it,*(unsigned_long *)(nameprefix_local + 0x120));
  std::operator+(&local_c0,(string *)&it,")\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&it);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_e8);
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_e8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar2) break;
    ppFVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)local_e8);
    local_f8 = *ppFVar3;
    if (local_f8->padding != 0) {
      NumToString<unsigned_long>(&local_158,local_f8->padding);
      std::operator+(&local_138,"\tbuilder.Pad(",&local_158);
      std::operator+(&local_118,&local_138,")\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
    }
    bVar2 = IsStruct(&(local_f8->value).type);
    psVar1 = code_ptr_local;
    if (bVar2) {
      struct_def_00 = (local_f8->value).type.struct_def;
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "_");
      std::operator+(&local_178,(char *)psVar1,&local_198);
      nameprefix_00 = (char *)std::__cxx11::string::c_str();
      StructBuilderBody(this,struct_def_00,nameprefix_00,code);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
    }
    else {
      GenMethod_abi_cxx11_(&local_1f8,this,local_f8);
      std::operator+(&local_1d8,"\tbuilder.Prepend",&local_1f8);
      std::operator+(&local_1b8,&local_1d8,"(");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      psVar1 = code_ptr_local;
      type = &local_f8->value;
      IdlNamer::Variable_abi_cxx11_(&local_278,&this->namer_,local_f8);
      std::operator+(&local_258,(char *)psVar1,&local_278);
      CastToBaseType(&local_238,this,&type->type,&local_258);
      std::operator+(&local_218,&local_238,")\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)local_e8);
  }
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\tbuilder.Prep(" + NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding)
        code += "\tbuilder.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field.value.type)) {
        StructBuilderBody(*field.value.type.struct_def,
                          (nameprefix + (field.name + "_")).c_str(), code_ptr);
      } else {
        code += "\tbuilder.Prepend" + GenMethod(field) + "(";
        code += CastToBaseType(field.value.type,
                               nameprefix + namer_.Variable(field)) +
                ")\n";
      }
    }
  }